

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O3

bool __thiscall helics::InputInfo::updateData(InputInfo *this,dataRecord *update,int index)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  pointer ppVar8;
  uint uVar9;
  pointer psVar10;
  SmallBuffer *__tmp;
  
  if (this->only_update_on_change == false) {
    psVar10 = (this->current_data).
              super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_002db6af:
    peVar1 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = psVar10[index].
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    psVar10[index].super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar1;
    psVar10[index].super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    uVar9 = update->iteration;
    ppVar5 = (this->current_data_time).
             super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = ppVar5 + index;
    ppVar5[index].first.internalTimeCode = (update->time).internalTimeCode;
  }
  else {
    psVar10 = (this->current_data).
              super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar1 = psVar10[index].
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_002db6af;
    peVar2 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __n = peVar1->bufferSize;
    if ((__n == peVar2->bufferSize) &&
       ((__n == 0 || (iVar7 = bcmp(peVar1->heap,peVar2->heap,__n), iVar7 == 0)))) {
      ppVar8 = (this->current_data_time).
               super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar8[index].first.internalTimeCode != (update->time).internalTimeCode) {
        return false;
      }
      ppVar8 = ppVar8 + index;
      uVar9 = update->iteration;
      bVar6 = false;
      goto LAB_002db6e9;
    }
    psVar10 = psVar10 + index;
    p_Var3 = (update->data).
             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (update->data).super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar10->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         peVar2;
    p_Var4 = (psVar10->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (psVar10->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
    ._M_pi = p_Var3;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    uVar9 = update->iteration;
    ppVar5 = (this->current_data_time).
             super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = ppVar5 + index;
    ppVar5[index].first.internalTimeCode = (update->time).internalTimeCode;
  }
  bVar6 = true;
LAB_002db6e9:
  ppVar8->second = uVar9;
  return bVar6;
}

Assistant:

bool InputInfo::updateData(dataRecord&& update, int index)
{
    if (!only_update_on_change || !current_data[index]) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }

    if (*current_data[index] != *(update.data)) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }
    if (current_data_time[index].first == update.time) {
        // this is for bookkeeping purposes should still return false
        current_data_time[index].second = update.iteration;
    }
    return false;
}